

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

Level * __thiscall hta::Metric::get_level(Metric *this,Duration interval)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>
  _Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>,_bool>
  pVar5;
  key_type local_50;
  Level local_48;
  
  p_Var1 = &(this->levels_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(long *)(p_Var2 + 1) < interval.__r]
      ) {
    if (interval.__r <= *(long *)(p_Var2 + 1)) {
      p_Var4 = p_Var2;
    }
  }
  _Var3._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (_Var3._M_node = p_Var4, interval.__r < *(long *)(p_Var4 + 1))) {
    _Var3._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)_Var3._M_node == p_Var1) {
    local_50.__r = interval.__r;
    restore_level(&local_48,this,interval);
    pVar5 = std::
            map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::Level>_>_>
            ::try_emplace<hta::Level>(&this->levels_,&local_50,&local_48);
    _Var3 = pVar5.first._M_node;
  }
  return (Level *)&_Var3._M_node[1]._M_parent;
}

Assistant:

Level& Metric::get_level(Duration interval)
{
    auto it = levels_.find(interval);
    if (it == levels_.end())
    {
        bool added;
        std::tie(it, added) = levels_.try_emplace(interval, restore_level(interval));
    }
    return it->second;
}